

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O3

void __thiscall Potassco::AspifTextInput::matchTerm(AspifTextInput *this)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  BufferedStream *pBVar4;
  
  pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
  bVar1 = pBVar4->buf_[pBVar4->rpos_];
  iVar3 = islower((uint)bVar1);
  if ((bVar1 == 0x5f) || (iVar3 != 0)) {
    do {
      do {
        pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
        BufferedStream::get(pBVar4);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
        pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
        bVar1 = pBVar4->buf_[pBVar4->rpos_];
        iVar3 = isalnum((uint)bVar1);
      } while (bVar1 == 0x5f);
    } while (iVar3 != 0);
    pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
    BufferedStream::skipWs(pBVar4);
    bVar2 = match(this,"(",false);
    if (bVar2) {
      std::__cxx11::string::_M_replace_aux
                ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
      matchAtomArg(this);
      bVar2 = match(this,",",false);
      if (bVar2) {
        do {
          std::__cxx11::string::_M_replace_aux
                    ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
          matchAtomArg(this);
          bVar2 = match(this,",",false);
        } while (bVar2);
      }
      match(this,")",true);
      std::__cxx11::string::_M_replace_aux
                ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
    }
  }
  else if (bVar1 == 0x22) {
    matchStr(this);
  }
  else {
    ProgramReader::require(&this->super_ProgramReader,false,"<term> expected");
  }
  pBVar4 = ProgramReader::stream(&this->super_ProgramReader);
  BufferedStream::skipWs(pBVar4);
  return;
}

Assistant:

void AspifTextInput::matchTerm() {
	char c = stream()->peek();
	if (std::islower(static_cast<unsigned char>(c)) != 0 || c == '_') {
		do { push(stream()->get()); } while (std::isalnum(static_cast<unsigned char>(c = stream()->peek())) != 0 || c == '_');
		skipws();
		if (match("(", false)) {
			push('(');
			for (;;) {
				matchAtomArg();
				if (!match(",", false)) break;
				push(',');
			}
			match(")");
			push(')');
		}
	}
	else if (c == '"') { matchStr(); }
	else { require(false, "<term> expected"); }
	skipws();
}